

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

Array<kj::String> * __thiscall
kj::anon_unknown_8::DiskHandle::listNames
          (Array<kj::String> *__return_storage_ptr__,DiskHandle *this)

{
  char *__s;
  long lVar1;
  String *pSVar2;
  RemoveConst<kj::String> *pRVar3;
  String *pSVar4;
  int iVar5;
  int iVar6;
  __off_t _Var7;
  DIR *__dirp;
  int *piVar8;
  dirent *pdVar9;
  size_t __n;
  ulong uVar10;
  size_t sVar11;
  Vector<kj::String> entries;
  Fault f;
  Array<kj::String> *result;
  Fault f_3;
  Vector<kj::String> local_78;
  String local_58;
  Array<kj::String> *local_40;
  Fault local_38;
  
  local_40 = __return_storage_ptr__;
  do {
    _Var7 = lseek((this->fd).fd,0,0);
    if (-1 < _Var7) {
      iVar5 = 0;
      break;
    }
    iVar5 = _::Debug::getOsErrorNumber(false);
  } while (iVar5 == -1);
  if (iVar5 != 0) {
    local_58.content.ptr = (char *)0x0;
    local_78.builder.ptr = (String *)0x0;
    local_78.builder.pos = (RemoveConst<kj::String> *)0x0;
    _::Debug::Fault::init
              ((Fault *)&local_58,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    _::Debug::Fault::fatal((Fault *)&local_58);
  }
  do {
    iVar5 = dup((this->fd).fd);
    if (-1 < iVar5) {
      iVar6 = 0;
      break;
    }
    iVar6 = _::Debug::getOsErrorNumber(false);
  } while (iVar6 == -1);
  if (iVar6 != 0) {
    local_58.content.ptr = (char *)0x0;
    local_78.builder.ptr = (String *)0x0;
    local_78.builder.pos = (RemoveConst<kj::String> *)0x0;
    _::Debug::Fault::init
              ((Fault *)&local_58,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    _::Debug::Fault::fatal((Fault *)&local_58);
  }
  __dirp = fdopendir(iVar5);
  if (__dirp == (DIR *)0x0) {
    close(iVar5);
    __errno_location();
    local_58.content.ptr = (char *)0x0;
    local_78.builder.ptr = (String *)0x0;
    local_78.builder.pos = (RemoveConst<kj::String> *)0x0;
    _::Debug::Fault::init
              ((Fault *)&local_58,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    _::Debug::Fault::fatal((Fault *)&local_58);
  }
  local_78.builder.ptr = (String *)0x0;
  local_78.builder.pos = (String *)0x0;
  local_78.builder.endPtr = (String *)0x0;
  piVar8 = __errno_location();
  do {
    *piVar8 = 0;
    pdVar9 = readdir(__dirp);
    if (pdVar9 == (dirent *)0x0) {
      if (*piVar8 != 0) {
        local_38.exception = (Exception *)0x0;
        local_58.content.ptr = (char *)0x0;
        local_58.content.size_ = 0;
        _::Debug::Fault::init
                  (&local_38,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                  );
        _::Debug::Fault::fatal(&local_38);
      }
    }
    else {
      __s = pdVar9->d_name;
      __n = strlen(__s);
      if (__n == 2) {
LAB_0022056c:
        iVar5 = bcmp(__s,"..",__n);
        if (iVar5 == 0) goto LAB_0022067f;
      }
      else if (__n == 1) {
        iVar5 = bcmp(__s,".",1);
        if (iVar5 == 0) goto LAB_0022067f;
        if (__n + 1 == 3) goto LAB_0022056c;
      }
      if ((__n + 1 < 9) || (*(long *)__s != 0x2e706d742d6a6b2e)) {
        if (pdVar9->d_type == '\0') {
          heapString(&local_58,__s,__n);
          if (local_78.builder.pos == local_78.builder.endPtr) {
            sVar11 = ((long)local_78.builder.endPtr - (long)local_78.builder.ptr >> 3) *
                     0x5555555555555556;
            if (local_78.builder.endPtr == local_78.builder.ptr) {
              sVar11 = 4;
            }
            Vector<kj::String>::setCapacity(&local_78,sVar11);
          }
        }
        else {
          heapString(&local_58,__s,__n);
          if (local_78.builder.pos == local_78.builder.endPtr) {
            sVar11 = ((long)local_78.builder.endPtr - (long)local_78.builder.ptr >> 3) *
                     0x5555555555555556;
            if (local_78.builder.endPtr == local_78.builder.ptr) {
              sVar11 = 4;
            }
            Vector<kj::String>::setCapacity(&local_78,sVar11);
          }
        }
        ((local_78.builder.pos)->content).ptr = local_58.content.ptr;
        ((local_78.builder.pos)->content).size_ = local_58.content.size_;
        ((local_78.builder.pos)->content).disposer = local_58.content.disposer;
        local_78.builder.pos = local_78.builder.pos + 1;
      }
    }
LAB_0022067f:
    if (pdVar9 == (dirent *)0x0) {
      if (local_78.builder.pos != local_78.builder.endPtr) {
        Vector<kj::String>::setCapacity
                  (&local_78,
                   ((long)local_78.builder.pos - (long)local_78.builder.ptr >> 3) *
                   -0x5555555555555555);
      }
      pRVar3 = local_78.builder.pos;
      pSVar2 = local_78.builder.ptr;
      uVar10 = ((long)local_78.builder.pos - (long)local_78.builder.ptr >> 3) * -0x5555555555555555;
      local_40->ptr = local_78.builder.ptr;
      local_40->size_ = uVar10;
      local_40->disposer = local_78.builder.disposer;
      local_78.builder.ptr = (String *)0x0;
      local_78.builder.pos = (RemoveConst<kj::String> *)0x0;
      local_78.builder.endPtr = (String *)0x0;
      if (pRVar3 != pSVar2) {
        lVar1 = 0x3f;
        if (uVar10 != 0) {
          for (; uVar10 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        std::__introsort_loop<kj::String*,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (pSVar2,pRVar3,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
        std::__final_insertion_sort<kj::String*,__gnu_cxx::__ops::_Iter_less_iter>(pSVar2,pRVar3);
      }
      pSVar4 = local_78.builder.endPtr;
      pRVar3 = local_78.builder.pos;
      pSVar2 = local_78.builder.ptr;
      if (local_78.builder.ptr != (String *)0x0) {
        local_78.builder.ptr = (String *)0x0;
        local_78.builder.pos = (RemoveConst<kj::String> *)0x0;
        local_78.builder.endPtr = (String *)0x0;
        (**(local_78.builder.disposer)->_vptr_ArrayDisposer)
                  (local_78.builder.disposer,pSVar2,0x18,
                   ((long)pRVar3 - (long)pSVar2 >> 3) * -0x5555555555555555,
                   ((long)pSVar4 - (long)pSVar2 >> 3) * -0x5555555555555555,
                   ArrayDisposer::Dispose_<kj::String,_false>::destruct);
      }
      closedir(__dirp);
      return local_40;
    }
  } while( true );
}

Assistant:

Array<String> listNames() const {
    return list(false, [](StringPtr name, FsNode::Type type) { return heapString(name); });
  }